

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_make_path_table(archive_write *a)

{
  int iVar1;
  int iVar2;
  iso9660_conflict *in_RDI;
  int dir_number;
  vdd *unaff_retaddr;
  int r;
  int depth;
  iso9660_conflict *iso9660;
  undefined4 in_stack_000000a8;
  undefined4 in_stack_000000ac;
  archive_write *in_stack_000000b0;
  int in_stack_ffffffffffffffdc;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  archive_write *a_00;
  int in_stack_fffffffffffffffc;
  
  a_00 = *(archive_write **)&(in_RDI->primary).max_depth;
  if ((*(int *)&a_00[2].client_closer < 8) ||
     (((*(uint *)&a_00[0xed].archive.error >> 0x13 & 1) != 0 &&
      ((*(uint *)&a_00[0xed].archive.error >> 0xe & 7) != 4)))) {
    iVar1 = isoent_alloc_path_table
                      (a_00,(vdd *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
  }
  else {
    iVar1 = isoent_alloc_path_table
                      (a_00,(vdd *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
  }
  if ((-1 < iVar1) &&
     (((*(uint *)&a_00[0xed].archive.error >> 0x11 & 3) == 0 ||
      (iVar1 = isoent_alloc_path_table
                         (a_00,(vdd *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),
                          in_stack_ffffffffffffffdc), -1 < iVar1)))) {
    isoent_collect_dirs((vdd *)in_RDI,(isoent *)a_00,in_stack_ffffffffffffffe4);
    if ((*(uint *)&a_00[0xed].archive.error >> 0x11 & 3) != 0) {
      isoent_collect_dirs((vdd *)in_RDI,(isoent *)a_00,in_stack_ffffffffffffffe4);
    }
    if (((*(uint *)&a_00[0xed].archive.error >> 0x17 & 3) == 0) ||
       (iVar1 = isoent_rr_move(a), -1 < iVar1)) {
      isofile_connect_hardlink_files(in_RDI);
      iVar1 = isoent_traverse_tree
                        (in_stack_000000b0,(vdd *)CONCAT44(in_stack_000000ac,in_stack_000000a8));
      if ((-1 < iVar1) &&
         (((*(uint *)&a_00[0xed].archive.error >> 0x11 & 3) == 0 ||
          (iVar1 = isoent_traverse_tree
                             (in_stack_000000b0,(vdd *)CONCAT44(in_stack_000000ac,in_stack_000000a8)
                             ), -1 < iVar1)))) {
        uVar3 = 1;
        for (iVar1 = 0; iVar1 < *(int *)&a_00->format_data; iVar1 = iVar1 + 1) {
          iVar2 = isoent_make_path_table_2(_r,unaff_retaddr,in_stack_fffffffffffffffc,(int *)in_RDI)
          ;
          if (iVar2 < 0) {
            return iVar2;
          }
        }
        if ((*(uint *)&a_00[0xed].archive.error >> 0x11 & 3) != 0) {
          uVar3 = 1;
          for (iVar1 = 0; iVar1 < *(int *)&a_00->format_write_data; iVar1 = iVar1 + 1) {
            iVar2 = isoent_make_path_table_2
                              (_r,unaff_retaddr,in_stack_fffffffffffffffc,(int *)in_RDI);
            if (iVar2 < 0) {
              return iVar2;
            }
          }
        }
        if (((*(uint *)&a_00[0xed].archive.error >> 0x14 & 1) == 0) || ((int)uVar3 < 0x10000)) {
          calculate_path_table_size((vdd *)&a_00->bytes_per_block);
          if ((*(uint *)&a_00[0xed].archive.error >> 0x11 & 3) != 0) {
            calculate_path_table_size((vdd *)&a_00->format_options);
          }
          iVar1 = 0;
        }
        else {
          archive_set_error((archive *)in_RDI,-1,"Too many directories(%d) over 65535.",(ulong)uVar3
                           );
          iVar1 = -0x1e;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int
isoent_make_path_table(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	int depth, r;
	int dir_number;

	/*
	 * Init Path Table.
	 */
	if (iso9660->dircnt_max >= MAX_DEPTH &&
	    (!iso9660->opt.limit_depth || iso9660->opt.iso_level == 4))
		r = isoent_alloc_path_table(a, &(iso9660->primary),
		    iso9660->dircnt_max + 1);
	else
		/* The number of levels in the hierarchy cannot exceed
		 * eight. */
		r = isoent_alloc_path_table(a, &(iso9660->primary),
		    MAX_DEPTH);
	if (r < 0)
		return (r);
	if (iso9660->opt.joliet) {
		r = isoent_alloc_path_table(a, &(iso9660->joliet),
		    iso9660->dircnt_max + 1);
		if (r < 0)
			return (r);
	}

	/* Step 0.
	 * - Collect directories for primary and joliet.
	 */
	isoent_collect_dirs(&(iso9660->primary), NULL, 0);
	if (iso9660->opt.joliet)
		isoent_collect_dirs(&(iso9660->joliet), NULL, 0);
	/*
	 * Rockridge; move deeper depth directories to rr_moved.
	 */
	if (iso9660->opt.rr) {
		r = isoent_rr_move(a);
		if (r < 0)
			return (r);
	}

 	/* Update nlink. */
	isofile_connect_hardlink_files(iso9660);

	/* Step 1.
	 * - Renew a value of the depth of that directories.
	 * - Resolve hardlinks.
 	 * - Convert pathnames to ISO9660 name or UCS2(joliet).
	 * - Sort files by each directory.
	 */
	r = isoent_traverse_tree(a, &(iso9660->primary));
	if (r < 0)
		return (r);
	if (iso9660->opt.joliet) {
		r = isoent_traverse_tree(a, &(iso9660->joliet));
		if (r < 0)
			return (r);
	}

	/* Step 2.
	 * - Sort directories.
	 * - Assign all directory number.
	 */
	dir_number = 1;
	for (depth = 0; depth < iso9660->primary.max_depth; depth++) {
		r = isoent_make_path_table_2(a, &(iso9660->primary),
		    depth, &dir_number);
		if (r < 0)
			return (r);
	}
	if (iso9660->opt.joliet) {
		dir_number = 1;
		for (depth = 0; depth < iso9660->joliet.max_depth; depth++) {
			r = isoent_make_path_table_2(a, &(iso9660->joliet),
			    depth, &dir_number);
			if (r < 0)
				return (r);
		}
	}
	if (iso9660->opt.limit_dirs && dir_number > 0xffff) {
		/*
		 * Maximum number of directories is 65535(0xffff)
		 * doe to size(16bit) of Parent Directory Number of
		 * the Path Table.
		 * See also ISO9660 Standard 9.4.
		 */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Too many directories(%d) over 65535.", dir_number);
		return (ARCHIVE_FATAL);
	}

	/* Get the size of the Path Table. */
	calculate_path_table_size(&(iso9660->primary));
	if (iso9660->opt.joliet)
		calculate_path_table_size(&(iso9660->joliet));

	return (ARCHIVE_OK);
}